

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void random_colors(Model *model,TGAImage *image)

{
  vec3f v;
  array<vec<3UL,_int>,_3UL> pts_00;
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  int j;
  size_t i;
  ulong iface;
  int *piVar5;
  vec3i vVar6;
  array<vec<3UL,_int>,_3UL> pts;
  vector<double,_std::allocator<double>_> zbuffer;
  allocator_type local_c1;
  TGAImage *local_c0;
  value_type_conflict local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  int local_98;
  value_type_conflict local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  int local_68;
  _Vector_base<double,_std::allocator<double>_> local_60;
  vec3f local_48;
  
  local_b8 = -1.79769313486232e+308;
  local_c0 = image;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_60,360000,&local_b8,&local_c1);
  iface = 0;
  while( true ) {
    sVar4 = Model::nfaces(model);
    if (sVar4 <= iface) break;
    local_98 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_b8 = 0.0;
    uStack_b0 = 0;
    piVar5 = (int *)&uStack_b0;
    for (sVar4 = 0; sVar4 != 3; sVar4 = sVar4 + 1) {
      Model::vert(&local_48,model,iface,sVar4);
      v.y = local_48.y;
      v.x = local_48.x;
      v.z = local_48.z;
      vVar6 = world2screen(v);
      *(long *)(piVar5 + -2) = vVar6._0_8_;
      *piVar5 = vVar6.z;
      piVar5 = piVar5 + 3;
    }
    local_68 = local_98;
    local_78 = local_a8;
    uStack_70 = uStack_a0;
    local_88 = local_b8;
    uStack_80 = uStack_b0;
    iVar1 = rand();
    iVar2 = rand();
    iVar3 = rand();
    pts_00._M_elems[0].z = (undefined4)uStack_80;
    pts_00._M_elems[1].x = uStack_80._4_4_;
    pts_00._M_elems[0]._0_8_ = local_88;
    pts_00._M_elems[1].y = (undefined4)local_78;
    pts_00._M_elems[1].z = local_78._4_4_;
    pts_00._M_elems[2].x = (undefined4)uStack_70;
    pts_00._M_elems[2].y = uStack_70._4_4_;
    pts_00._M_elems[2].z = local_68;
    triangle(pts_00,(vector<double,_std::allocator<double>_> *)&local_60,local_c0,
             (TGAColor)
             ((uint5)(iVar3 % 0xff & 0xffU | (iVar2 % 0xff & 0xffU) << 8 | iVar1 % 0xff << 0x10) |
             0x4ff000000));
    iface = iface + 1;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
  return;
}

Assistant:

void random_colors(Model &model, TGAImage &image)
{
    vec3f light_dir{0, 0, -1};
    std::vector<double> zbuffer(width * height, -std::numeric_limits<double>::max());
    for (size_t i = 0; i < model.nfaces(); i++) {
        std::array<vec3i, 3> pts;
        for (int j = 0; j < 3; j++) pts[j] = world2screen(model.vert(i, j));
        triangle(pts, zbuffer, image, TGAColor(rand() % 255, rand() % 255, rand() % 255, 255));
    }
}